

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_Init(CLzmaEnc *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long in_RDI;
  UInt32 j_1;
  UInt16 *probs_1;
  UInt16 *probs;
  UInt32 num;
  UInt32 j;
  UInt32 i;
  undefined4 local_2c;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 0x4c + (ulong)local_c * 4) = 0;
  }
  RangeEnc_Init((CRangeEnc *)(in_RDI + 0xb8));
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      *(undefined2 *)(in_RDI + 0x33c54 + (ulong)local_c * 0x20 + (ulong)local_10 * 2) = 0x400;
      *(undefined2 *)(in_RDI + 0x33e34 + (ulong)local_c * 0x20 + (ulong)local_10 * 2) = 0x400;
    }
    *(undefined2 *)(in_RDI + 0x33dd4 + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33dec + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33e04 + (ulong)local_c * 2) = 0x400;
    *(undefined2 *)(in_RDI + 0x33e1c + (ulong)local_c * 2) = 0x400;
  }
  uVar1 = *(undefined4 *)(in_RDI + 100);
  uVar2 = *(undefined4 *)(in_RDI + 0x60);
  lVar3 = *(long *)(in_RDI + 0x78);
  for (local_c = 0; local_c < (uint)(0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU));
      local_c = local_c + 1) {
    *(undefined2 *)(lVar3 + (ulong)local_c * 2) = 0x400;
  }
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
      *(undefined2 *)(in_RDI + 0x33fb4 + (ulong)local_c * 0x80 + (ulong)local_2c * 2) = 0x400;
    }
  }
  for (local_c = 0; local_c < 0x72; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0x341b4 + (ulong)local_c * 2) = 0x400;
  }
  LenEnc_Init((CLenEnc *)(in_RDI + 0x342b8));
  LenEnc_Init((CLenEnc *)(in_RDI + 0x38b00));
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0x34298 + (ulong)local_c * 2) = 0x400;
  }
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(int *)(in_RDI + 0x70) = (1 << ((byte)*(undefined4 *)(in_RDI + 0x68) & 0x1f)) + -1;
  *(int *)(in_RDI + 0x6c) = (1 << ((byte)*(undefined4 *)(in_RDI + 100) & 0x1f)) + -1;
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc *p)
{
  UInt32 i;
  p->state = 0;
  for (i = 0 ; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);


  for (i = 0; i < kNumStates; i++)
  {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++)
    {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = (UInt32)0x300 << (p->lp + p->lc);
    CLzmaProb *probs = p->litProbs;
    for (i = 0; i < num; i++)
      probs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++)
    {
      CLzmaProb *probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}